

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O0

void __thiscall
Liby::WeakTimerHolder::WeakTimerHolder(WeakTimerHolder *this,shared_ptr<Liby::Timer> *timer)

{
  element_type *peVar1;
  uint64_t id;
  Timestamp *timeout;
  function<void_()> local_38;
  __shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<Liby::Timer> *timer_local;
  WeakTimerHolder *this_local;
  
  local_18 = (__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)timer;
  timer_local = (shared_ptr<Liby::Timer> *)this;
  peVar1 = std::__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      timer);
  id = Timer::id(peVar1);
  peVar1 = std::__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  timeout = Timer::timeout(peVar1);
  std::function<void_()>::function(&local_38,(nullptr_t)0x0);
  Timer::Timer(&this->timer_,id,timeout,&local_38);
  std::function<void_()>::~function(&local_38);
  std::weak_ptr<Liby::Timer>::weak_ptr<Liby::Timer,void>
            (&this->weakTimerPtr_,(shared_ptr<Liby::Timer> *)local_18);
  return;
}

Assistant:

WeakTimerHolder(const std::shared_ptr<Timer> &timer)
        : timer_(timer->id(), timer->timeout(), nullptr), weakTimerPtr_(timer) {
    }